

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

void Cec_GiaSplitPrint(int nIter,int Depth,int nVars,int nConfs,int fStatus,double Prog,abctime clk)

{
  char *pcVar1;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  char *pStr;
  
  printf("%4d : ",nIter);
  printf("Depth =%3d  ",(ulong)(uint)Depth);
  printf("SatVar =%7d  ",(ulong)(uint)nVars);
  printf("SatConf =%7d   ",(ulong)(uint)nConfs);
  pcVar1 = "UNDECIDED";
  if (fStatus == 1) {
    pcVar1 = "UNSAT    ";
  }
  pStr = "SAT      ";
  if (fStatus != 0) {
    pStr = pcVar1;
  }
  printf("%s   ");
  printf("Solved %8.4f %%   ",Prog * 100.0);
  Abc_PrintTime((int)clk,pStr,CONCAT44(extraout_var,extraout_EDX));
  fflush(_stdout);
  return;
}

Assistant:

void Cec_GiaSplitPrint( int nIter, int Depth, int nVars, int nConfs, int fStatus, double Prog, abctime clk )
{
    printf( "%4d : ",             nIter );
    printf( "Depth =%3d  ",       Depth );
    printf( "SatVar =%7d  ",      nVars );
    printf( "SatConf =%7d   ",    nConfs );
    printf( "%s   ",              fStatus ? (fStatus == 1 ? "UNSAT    " : "UNDECIDED") : "SAT      " );
    printf( "Solved %8.4f %%   ", 100*Prog );
    Abc_PrintTime( 1, "Time", clk );
    //ABC_PRTr( "Time", Abc_Clock()-clk );
    fflush( stdout );
}